

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O2

int lj_cf_debug_setuservalue(lua_State *L)

{
  TValue *pTVar1;
  int tt;
  int narg;
  
  pTVar1 = L->base;
  if ((pTVar1 < L->top) && ((pTVar1->field_2).it == 0xfffffff3)) {
    if ((pTVar1 + 1 < L->top) && (*(int *)((long)pTVar1 + 0xc) == -0xc)) {
      L->top = pTVar1 + 2;
      lua_setfenv(L,1);
      return 1;
    }
    narg = 2;
    tt = 5;
  }
  else {
    narg = 1;
    tt = 7;
  }
  lj_err_argt(L,narg,tt);
}

Assistant:

LJLIB_CF(debug_setuservalue)
{
  TValue *o = L->base;
  if (!(o < L->top && tvisudata(o)))
    lj_err_argt(L, 1, LUA_TUSERDATA);
  if (!(o+1 < L->top && tvistab(o+1)))
    lj_err_argt(L, 2, LUA_TTABLE);
  L->top = o+2;
  lua_setfenv(L, 1);
  return 1;
}